

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::UniformCase::writeUniformComparisons
          (UniformCase *this,ostringstream *dst,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,char *variableName)

{
  pointer pBVar1;
  ostream *poVar2;
  UniformCase *this_00;
  ostringstream *poVar3;
  long lVar4;
  char *pcVar5;
  int i;
  long lVar6;
  
  lVar4 = 0;
  for (lVar6 = 0;
      pBVar1 = (basicUniforms->
               super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar6 < (int)(((long)(basicUniforms->
                           super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x98);
      lVar6 = lVar6 + 1) {
    if ((&pBVar1->isUsedInShader)[lVar4] == true) {
      poVar2 = std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\t");
      this_00 = (UniformCase *)std::operator<<(poVar2,variableName);
      std::operator<<((ostream *)this_00," *= ");
      writeUniformCompareExpr
                (this_00,dst,
                 (BasicUniform *)
                 ((long)&(((basicUniforms->
                           super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                           )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                 lVar4));
      pcVar5 = ";\n";
      poVar3 = dst;
    }
    else {
      poVar2 = std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                               "\t// UNUSED: ");
      poVar3 = (ostringstream *)
               std::operator<<(poVar2,(string *)
                                      ((long)&(((basicUniforms->
                                                super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->name).
                                              _M_dataplus._M_p + lVar4));
      pcVar5 = "\n";
    }
    std::operator<<(&poVar3->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
    lVar4 = lVar4 + 0x98;
  }
  return;
}

Assistant:

void UniformCase::writeUniformComparisons (std::ostringstream& dst, const vector<BasicUniform>& basicUniforms, const char* const variableName) const
{
	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		const BasicUniform& unif = basicUniforms[i];

		if (unif.isUsedInShader)
		{
			dst << "\t" << variableName << " *= ";
			writeUniformCompareExpr(dst, basicUniforms[i]);
			dst << ";\n";
		}
		else
			dst << "\t// UNUSED: " << basicUniforms[i].name << "\n";
	}
}